

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O3

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  long lVar1;
  uudecode *uudecode;
  int iVar2;
  uint uVar3;
  byte *b;
  size_t size;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  char *fmt;
  byte *pbVar8;
  byte bVar9;
  int iVar10;
  archive_read *a;
  size_t sVar11;
  size_t sVar12;
  bool bVar13;
  ssize_t avail_in;
  ssize_t nl;
  long local_70;
  uchar *local_68;
  size_t local_50;
  size_t local_48;
  void **local_40;
  long local_38;
  
  uudecode = (uudecode *)self->data;
  b = (byte *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_50);
  bVar13 = b == (byte *)0x0;
  local_40 = buff;
  if (!bVar13 || -1 < (long)local_50) {
    do {
      if (bVar13) {
        local_50 = 0;
      }
      local_48 = local_50;
      if (uudecode->state == 4) {
        local_70 = 0;
        sVar11 = local_50;
        sVar12 = local_50;
LAB_0013df4f:
        lVar6 = 0;
        if ((long)local_48 < (long)sVar11) {
          lVar6 = local_48 - sVar11;
        }
        __archive_read_filter_consume(self->upstream,lVar6 + sVar12);
        *local_40 = uudecode->out_buff;
        uudecode->total = uudecode->total + local_70;
        return local_70;
      }
      local_68 = uudecode->out_buff;
      if ((long)uudecode->in_cnt != 0) {
        iVar2 = ensure_in_buff_size(self,uudecode,(long)uudecode->in_cnt + local_50);
        if (iVar2 != 0) {
          return -0x1e;
        }
        memcpy(uudecode->in_buff + uudecode->in_cnt,b,local_50);
        b = uudecode->in_buff;
        local_50 = (long)uudecode->in_cnt + local_50;
        uudecode->in_cnt = 0;
      }
      if ((long)local_50 < 1) {
        local_70 = 0;
        sVar11 = local_50;
        sVar12 = 0;
        goto LAB_0013df4f;
      }
      local_70 = 0;
      sVar12 = 0;
LAB_0013d8f5:
      sVar11 = local_50;
      size = get_line(b,local_50 - sVar12,&local_38);
      if ((long)size < 0) {
        if ((uudecode->state == 0) && ((0 < uudecode->total || (0 < local_70)))) {
          uudecode->state = 4;
          sVar12 = sVar11;
          goto LAB_0013df4f;
        }
LAB_0013def9:
        a = self->archive;
        fmt = "Insufficient compressed data";
        iVar2 = -1;
        goto LAB_0013df0e;
      }
      iVar2 = uudecode->state;
      if (local_38 != 0) {
        if (iVar2 == 1) {
          if ((long)(local_70 + size * 2) < 0x10001) {
            if ((""[*b] != '\0') && (0 < (long)(size - local_38))) {
              uVar3 = *b & 0x3f;
              uVar5 = (ulong)uVar3 ^ 0x20;
              if (uVar5 < size - local_38) {
                if ((char)uVar3 == ' ') {
                  uudecode->state = 2;
                }
                else {
                  pbVar8 = b + 1;
                  lVar4 = 2;
                  lVar6 = 0;
                  do {
                    if ((""[*pbVar8] == '\0') || (""[pbVar8[1]] == '\0')) goto LAB_0013def9;
                    iVar2 = (pbVar8[1] & 0x3f ^ 0x20) << 0xc;
                    local_68[lVar4 + -2] =
                         (byte)(((*pbVar8 ^ 0x20) << 0x12) >> 0x10) | (byte)((uint)iVar2 >> 0x10);
                    if (uVar5 + lVar6 == 1) {
                      local_70 = (local_70 - lVar6) + 1;
                      local_68 = local_68 + (1 - lVar6);
                      goto LAB_0013d9bf;
                    }
                    if (""[pbVar8[2]] == '\0') goto LAB_0013def9;
                    iVar10 = (pbVar8[2] & 0x3f ^ 0x20) << 6;
                    local_68[lVar4 + -1] = (byte)((uint)iVar2 >> 8) | (byte)((uint)iVar10 >> 8);
                    if (uVar5 + lVar6 == 2) {
                      lVar6 = -lVar6;
                      goto LAB_0013de27;
                    }
                    if (""[pbVar8[3]] == '\0') goto LAB_0013def9;
                    local_68[lVar4] = ((byte)iVar10 | pbVar8[3] & 0x3f) ^ 0x20;
                    lVar7 = uVar5 + lVar6;
                    lVar6 = lVar6 + -3;
                    lVar4 = lVar4 + 3;
                    pbVar8 = pbVar8 + 4;
                  } while (3 < lVar7);
                  local_70 = local_70 - lVar6;
                  local_68 = local_68 + -lVar6;
                }
                goto LAB_0013d9bf;
              }
            }
            goto LAB_0013def9;
          }
          goto LAB_0013df4f;
        }
        if (iVar2 == 2) goto LAB_0013d98e;
        if (iVar2 == 3) {
          if (0x10000 < (long)(local_70 + size * 2)) goto LAB_0013df4f;
          lVar4 = size - local_38;
          if (2 < lVar4) {
            if (((*b != 0x3d) || (b[1] != 0x3d)) || (b[2] != 0x3d)) goto LAB_0013dac9;
            goto LAB_0013d9b8;
          }
          pbVar8 = b;
          if (0 < lVar4) {
LAB_0013dac9:
            pbVar8 = b + 2;
            lVar6 = 0;
            lVar7 = 0;
            do {
              bVar9 = pbVar8[-2];
              if ((""[bVar9] == '\0') || (""[pbVar8[-1]] == '\0')) {
                local_70 = local_70 + lVar6;
                local_68 = local_68 + lVar6;
                goto LAB_0013ddac;
              }
              iVar2 = base64num[pbVar8[-1]];
              local_68[lVar6] =
                   (byte)((uint)(base64num[bVar9] << 0x12) >> 0x10) |
                   (byte)((uint)(iVar2 << 0xc) >> 0x10);
              if ((ulong)(lVar4 + lVar7) < 3) {
                local_70 = local_70 + lVar6 + 1;
                lVar4 = lVar4 + lVar7 + -2;
                local_68 = local_68 + lVar6 + 1;
                pbVar8 = b + (2 - lVar7);
                goto LAB_0013dda0;
              }
              uVar5 = (ulong)*pbVar8;
              if (uVar5 == 0x3d) {
                local_70 = local_70 + lVar6 + 1;
                local_68 = local_68 + lVar6 + 1;
                goto LAB_0013d9bf;
              }
              if (""[uVar5] == '\0') goto LAB_0013def9;
              iVar10 = base64num[uVar5];
              local_68[lVar6 + 1] =
                   (byte)((uint)(iVar2 << 0xc) >> 8) | (byte)((uint)(iVar10 << 6) >> 8);
              if ((lVar4 + lVar7 == 3) || (uVar5 = (ulong)pbVar8[1], uVar5 == 0x3d))
              goto LAB_0013de27;
              if (""[uVar5] == '\0') goto LAB_0013def9;
              local_68[lVar6 + 2] = (byte)(iVar10 << 6) | (byte)base64num[uVar5];
              lVar1 = lVar4 + lVar7;
              lVar7 = lVar7 + -4;
              lVar6 = lVar6 + 3;
              pbVar8 = pbVar8 + 4;
            } while (4 < lVar1);
            lVar4 = lVar4 + lVar7;
            local_70 = local_70 + lVar6;
            local_68 = local_68 + lVar6;
            pbVar8 = b + -lVar7;
          }
LAB_0013dda0:
          if (lVar4 != 0) {
            bVar9 = *pbVar8;
LAB_0013ddac:
            if (bVar9 != 0x3d) goto LAB_0013def9;
          }
        }
        else {
          if (0x1ffff < (long)(local_70 + size)) {
            a = self->archive;
            fmt = "Invalid format data";
            goto LAB_0013dfa5;
          }
          if (10 < (long)(size - local_38)) {
            bVar13 = *(short *)(b + 4) == 0x206e && *(int *)b == 0x69676562;
            if (bVar13) {
              lVar6 = 6;
            }
            else {
              if ((size - local_38 < 0x12) ||
                 (*(long *)(b + 5) != 0x203436657361622d || *(long *)b != 0x61622d6e69676562))
              goto LAB_0013d9bf;
              lVar6 = 0xd;
            }
            if (((((b[lVar6] & 0xf8) == 0x30) && ((b[lVar6 + 1] & 0xf8) == 0x30)) &&
                ((b[lVar6 + 2] & 0xf8) == 0x30)) && (b[lVar6 + 3] == 0x20)) {
              if (bVar13) {
                uudecode->state = 1;
              }
              else {
                uudecode->state = 3;
              }
            }
          }
        }
        goto LAB_0013d9bf;
      }
      if (iVar2 == 2) {
LAB_0013d98e:
        if ((size - local_38 != 3) || (b[2] != 100 || *(short *)b != 0x6e65)) goto LAB_0013def9;
LAB_0013d9b8:
        uudecode->state = 0;
        goto LAB_0013d9bf;
      }
      if ((long)local_48 < 1 && local_70 == 0) {
        a = self->archive;
        fmt = "Missing format data";
LAB_0013dfa5:
        iVar2 = 0x54;
LAB_0013df0e:
        archive_set_error(&a->archive,iVar2,fmt);
        return -0x1e;
      }
      iVar2 = ensure_in_buff_size(self,uudecode,size);
      if (iVar2 != 0) {
        return -0x1e;
      }
      if (uudecode->in_buff != b) {
        memmove(uudecode->in_buff,b,size);
      }
      uudecode->in_cnt = (int)size;
      if (local_70 != 0) {
        sVar11 = local_50;
        sVar12 = sVar12 + size;
        goto LAB_0013df4f;
      }
      __archive_read_filter_consume(self->upstream,local_48);
      b = (byte *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_50);
      bVar13 = b == (byte *)0x0;
    } while (!bVar13 || -1 < (long)local_50);
  }
  return -0x1e;
LAB_0013de27:
  local_68 = local_68 + lVar6 + 2;
  local_70 = local_70 + lVar6 + 2;
LAB_0013d9bf:
  b = b + size;
  sVar12 = sVar12 + size;
  sVar11 = local_50;
  if ((long)local_50 <= (long)sVar12) goto LAB_0013df4f;
  goto LAB_0013d8f5;
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		int64_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if ((nl == 0) && (uudecode->state != ST_UUEND)) {
			if (total == 0 && ravail <= 0) {
				/* There is nothing more to read, fail */
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing format data");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = (int)len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			used += len;
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of current line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!uuchar[b[0]] || !uuchar[b[1]])
					break;
				n = UUDECODE(*b++) << 18;
				n |= UUDECODE(*b++) << 12;
				*out++ = n >> 16; total++;
				--l;

				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!base64[b[0]] || !base64[b[1]])
					break;
				n = base64num[*b++] << 18;
				n |= base64num[*b++] << 12;
				*out++ = n >> 16; total++;
				l -= 2;

				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}